

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

WeightParams * __thiscall
CoreML::Specification::GRULayerParams::mutable_updategateweightmatrix(GRULayerParams *this)

{
  WeightParams *this_00;
  GRULayerParams *this_local;
  
  if (this->updategateweightmatrix_ == (WeightParams *)0x0) {
    this_00 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(this_00);
    this->updategateweightmatrix_ = this_00;
  }
  return this->updategateweightmatrix_;
}

Assistant:

inline ::CoreML::Specification::WeightParams* GRULayerParams::mutable_updategateweightmatrix() {
  
  if (updategateweightmatrix_ == NULL) {
    updategateweightmatrix_ = new ::CoreML::Specification::WeightParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.GRULayerParams.updateGateWeightMatrix)
  return updategateweightmatrix_;
}